

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

void __thiscall
soul::AST::TypeMetaFunction::throwErrorIfUnresolved(TypeMetaFunction *this,Type *sourceType)

{
  bool bVar1;
  Expression *pEVar2;
  CompileMessage local_108;
  CompileMessage local_d0;
  CompileMessage local_98;
  CompileMessage local_50;
  Type *local_18;
  Type *sourceType_local;
  TypeMetaFunction *this_local;
  
  local_18 = sourceType;
  sourceType_local = (Type *)this;
  bVar1 = checkSourceType(this,sourceType);
  if (!bVar1) {
    if (this->operation == size) {
      pEVar2 = pool_ref<soul::AST::Expression>::operator->(&this->source);
      Errors::cannotTakeSizeOfType<>();
      Context::throwError(&(pEVar2->super_Statement).super_ASTObject.context,&local_50,false);
    }
    if (this->operation == makeConst) {
      Errors::tooManyConsts<>();
      Context::throwError(&(this->super_Expression).super_Statement.super_ASTObject.context,
                          &local_98,false);
    }
    if (this->operation == elementType) {
      Errors::badTypeForElementType<>();
      Context::throwError(&(this->super_Expression).super_Statement.super_ASTObject.context,
                          &local_d0,false);
    }
    if (this->operation == primitiveType) {
      Errors::badTypeForPrimitiveType<>();
      Context::throwError(&(this->super_Expression).super_Statement.super_ASTObject.context,
                          &local_108,false);
    }
  }
  return;
}

Assistant:

void throwErrorIfUnresolved (const Type& sourceType) const
        {
            if (! checkSourceType (sourceType))
            {
                if (operation == Op::size)           source->context.throwError (Errors::cannotTakeSizeOfType());
                if (operation == Op::makeConst)      context.throwError (Errors::tooManyConsts());
                if (operation == Op::elementType)    context.throwError (Errors::badTypeForElementType());
                if (operation == Op::primitiveType)  context.throwError (Errors::badTypeForPrimitiveType());
            }
        }